

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O3

void __thiscall soul::heart::Printer::PrinterStream::printLatency(PrinterStream *this)

{
  CodePrinter *pCVar1;
  string_view text;
  string_view text_00;
  string local_30;
  
  if (this->module->latency != 0) {
    pCVar1 = this->out;
    text._M_str = "processor.latency = ";
    text._M_len = 0x14;
    choc::text::CodePrinter::writeBlock(pCVar1,text);
    pCVar1 = choc::text::CodePrinter::operator<<(pCVar1,this->module->latency);
    text_00._M_str = ";";
    text_00._M_len = 1;
    choc::text::CodePrinter::writeBlock(pCVar1,text_00);
    local_30.field_2._M_allocated_capacity._0_2_ = 10;
    local_30._M_string_length = 1;
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    choc::text::CodePrinter::append(pCVar1,&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,
                      CONCAT62(local_30.field_2._M_allocated_capacity._2_6_,
                               local_30.field_2._M_allocated_capacity._0_2_) + 1);
    }
  }
  return;
}

Assistant:

void printLatency()
        {
            if (module.latency != 0)
                out << "processor.latency = " << module.latency << ";" << newLine;
        }